

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetTemplateGlobalValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  bool bVar18;
  TemplateDictionary *pTVar19;
  TemplateDictionary *pTVar20;
  char *pcVar21;
  TemplateString local_320;
  TemplateString local_300;
  TemplateDictionaryPeer peer;
  TemplateDictionaryPeer subsubdict_peer;
  TemplateDictionaryPeer subdict2_peer;
  TemplateDictionaryPeer includedict2_peer;
  TemplateDictionaryPeer includedict_peer;
  TemplateDictionaryPeer subdict_peer;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_320,"test_SetTemplateGlobalValue");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_320,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b0,"section1");
  TVar1.length_ = local_b0.length_;
  TVar1.ptr_ = local_b0.ptr_;
  TVar1.is_immutable_ = local_b0.is_immutable_;
  TVar1._17_7_ = local_b0._17_7_;
  TVar1.id_ = local_b0.id_;
  pTVar19 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_d0,"section1\'s child");
  TVar2.length_ = local_d0.length_;
  TVar2.ptr_ = local_d0.ptr_;
  TVar2.is_immutable_ = local_d0.is_immutable_;
  TVar2._17_7_ = local_d0._17_7_;
  TVar2.id_ = local_d0.id_;
  pTVar20 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar2);
  ctemplate::TemplateString::TemplateString(&local_f0,"include1");
  TVar3.length_ = local_f0.length_;
  TVar3.ptr_ = local_f0.ptr_;
  TVar3.is_immutable_ = local_f0.is_immutable_;
  TVar3._17_7_ = local_f0._17_7_;
  TVar3.id_ = local_f0.id_;
  includedict_peer.dict_ =
       (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  peer.dict_ = &dict;
  subsubdict_peer.dict_ = pTVar20;
  subdict_peer.dict_ = pTVar19;
  ctemplate::TemplateString::TemplateString(&local_110,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_130,"templateval");
  TVar4.length_ = local_110.length_;
  TVar4.ptr_ = local_110.ptr_;
  TVar4.is_immutable_ = local_110.is_immutable_;
  TVar4._17_7_ = local_110._17_7_;
  TVar4.id_ = local_110.id_;
  TVar13.length_ = local_130.length_;
  TVar13.ptr_ = local_130.ptr_;
  TVar13.is_immutable_ = local_130.is_immutable_;
  TVar13._17_7_ = local_130._17_7_;
  TVar13.id_ = local_130.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar4,TVar13);
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "subdict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "subsubdict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "includedict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_150,"section2");
  TVar5.length_ = local_150.length_;
  TVar5.ptr_ = local_150.ptr_;
  TVar5.is_immutable_ = local_150.is_immutable_;
  TVar5._17_7_ = local_150._17_7_;
  TVar5.id_ = local_150.id_;
  pTVar19 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
  ctemplate::TemplateString::TemplateString(&local_170,"include2");
  TVar6.length_ = local_170.length_;
  TVar6.ptr_ = local_170.ptr_;
  TVar6.is_immutable_ = local_170.is_immutable_;
  TVar6._17_7_ = local_170._17_7_;
  TVar6.id_ = local_170.id_;
  includedict2_peer.dict_ =
       (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  subdict2_peer.dict_ = pTVar19;
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict2_peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "subdict2_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_320,&local_300);
  if (!bVar18) {
    pcVar21 = "includedict2_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")";
    goto LAB_0010d3d6;
  }
  ctemplate::TemplateString::TemplateString(&local_190,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_1b0,"templateval2");
  TVar7.length_ = local_190.length_;
  TVar7.ptr_ = local_190.ptr_;
  TVar7.is_immutable_ = local_190.is_immutable_;
  TVar7._17_7_ = local_190._17_7_;
  TVar7.id_ = local_190.id_;
  TVar14.length_ = local_1b0.length_;
  TVar14.ptr_ = local_1b0.ptr_;
  TVar14.is_immutable_ = local_1b0.is_immutable_;
  TVar14._17_7_ = local_1b0._17_7_;
  TVar14.id_ = local_1b0.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar7,TVar14);
  ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_320,&local_300);
  if (bVar18) {
    ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_320,&local_300);
    if (!bVar18) {
      pcVar21 = "subdict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
      goto LAB_0010d3d6;
    }
    ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_320,&local_300);
    if (!bVar18) {
      pcVar21 = "subsubdict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
      goto LAB_0010d3d6;
    }
    ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_320,&local_300);
    if (!bVar18) {
      pcVar21 = "includedict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
      goto LAB_0010d3d6;
    }
    ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict2_peer,&local_320,&local_300);
    if (!bVar18) {
LAB_0010d112:
      pcVar21 = "subdict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
      goto LAB_0010d3d6;
    }
    ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_320,&local_300);
    if (bVar18) {
      ctemplate::TemplateString::TemplateString(&local_1d0,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_1f0,"templateval3");
      TVar8.length_ = local_1d0.length_;
      TVar8.ptr_ = local_1d0.ptr_;
      TVar8.is_immutable_ = local_1d0.is_immutable_;
      TVar8._17_7_ = local_1d0._17_7_;
      TVar8.id_ = local_1d0.id_;
      TVar15.length_ = local_1f0.length_;
      TVar15.ptr_ = local_1f0.ptr_;
      TVar15.is_immutable_ = local_1f0.is_immutable_;
      TVar15._17_7_ = local_1f0._17_7_;
      TVar15.id_ = local_1f0.id_;
      ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar8,TVar15);
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "subdict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "subsubdict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "includedict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict2_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "subdict2_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL3");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval3");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "includedict2_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_210,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_230,"subdictval");
      TVar9.length_ = local_210.length_;
      TVar9.ptr_ = local_210.ptr_;
      TVar9.is_immutable_ = local_210.is_immutable_;
      TVar9._17_7_ = local_210._17_7_;
      TVar9.id_ = local_210.id_;
      TVar16.length_ = local_230.length_;
      TVar16.ptr_ = local_230.ptr_;
      TVar16.is_immutable_ = local_230.is_immutable_;
      TVar16._17_7_ = local_230._17_7_;
      TVar16.id_ = local_230.id_;
      ctemplate::TemplateDictionary::SetValue(TVar9,TVar16);
      ctemplate::TemplateString::TemplateString(&local_250,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_270,"includedictval");
      TVar10.length_ = local_250.length_;
      TVar10.ptr_ = local_250.ptr_;
      TVar10.is_immutable_ = local_250.is_immutable_;
      TVar10._17_7_ = local_250._17_7_;
      TVar10.id_ = local_250.id_;
      TVar17.length_ = local_270.length_;
      TVar17.ptr_ = local_270.ptr_;
      TVar17.is_immutable_ = local_270.is_immutable_;
      TVar17._17_7_ = local_270._17_7_;
      TVar17.id_ = local_270.id_;
      ctemplate::TemplateDictionary::SetValue(TVar10,TVar17);
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,&local_320,&local_300);
      if (!bVar18) goto LAB_0010d0f5;
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"subdictval");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "subdict_peer.ValueIs(\"TEMPLATEVAL2\", \"subdictval\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"subdictval");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "subsubdict_peer.ValueIs(\"TEMPLATEVAL2\", \"subdictval\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"includedictval");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_320,&local_300);
      if (!bVar18) {
        pcVar21 = "includedict_peer.ValueIs(\"TEMPLATEVAL2\", \"includedictval\")";
        goto LAB_0010d3d6;
      }
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict2_peer,&local_320,&local_300);
      if (!bVar18) goto LAB_0010d112;
      ctemplate::TemplateString::TemplateString(&local_320,"TEMPLATEVAL2");
      ctemplate::TemplateString::TemplateString(&local_300,"templateval2");
      bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_320,&local_300);
      if (bVar18) {
        ctemplate::TemplateString::TemplateString(&local_290,"ShownTemplateGlobalSection");
        TVar11.length_ = local_290.length_;
        TVar11.ptr_ = local_290.ptr_;
        TVar11.is_immutable_ = local_290.is_immutable_;
        TVar11._17_7_ = local_290._17_7_;
        TVar11.id_ = local_290.id_;
        ctemplate::TemplateDictionary::ShowTemplateGlobalSection(TVar11);
        ctemplate::TemplateString::TemplateString(&local_320,"ShownTemplateGlobalSection");
        bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_320);
        if (bVar18) {
          pcVar21 = "!(peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))";
        }
        else {
          ctemplate::TemplateString::TemplateString(&local_320,"ShownTemplateGlobalSection");
          bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict2_peer,&local_320);
          if (bVar18) {
            pcVar21 = "!(subdict2_peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))";
          }
          else {
            ctemplate::TemplateString::TemplateString(&local_320,"ShownTemplateGlobalSection");
            bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subsubdict_peer,&local_320)
            ;
            if (bVar18) {
              pcVar21 = "!(subsubdict_peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))";
            }
            else {
              ctemplate::TemplateString::TemplateString(&local_2b0,"ShownFromAChild");
              TVar12.length_ = local_2b0.length_;
              TVar12.ptr_ = local_2b0.ptr_;
              TVar12.is_immutable_ = local_2b0.is_immutable_;
              TVar12._17_7_ = local_2b0._17_7_;
              TVar12.id_ = local_2b0.id_;
              ctemplate::TemplateDictionary::ShowTemplateGlobalSection(TVar12);
              ctemplate::TemplateString::TemplateString(&local_320,"ShownFromAChild");
              bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_320);
              if (bVar18) {
                pcVar21 = "!(peer.IsHiddenSection(\"ShownFromAChild\"))";
              }
              else {
                ctemplate::TemplateString::TemplateString(&local_320,"ShownFromAChild");
                bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection
                                   (&subsubdict_peer,&local_320);
                if (!bVar18) {
                  ctemplate::TemplateString::TemplateString(&local_320,"NAVBAR_SECTION");
                  ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_320);
                  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                  return;
                }
                pcVar21 = "!(subsubdict_peer.IsHiddenSection(\"ShownFromAChild\"))";
              }
            }
          }
        }
        goto LAB_0010d3d6;
      }
    }
    pcVar21 = "includedict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
  }
  else {
LAB_0010d0f5:
    pcVar21 = "peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")";
  }
LAB_0010d3d6:
  fprintf(_stderr,"Check failed: %s\n",pcVar21);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetTemplateGlobalValue) {
  // The functionality involving it passing across the included dictionaries
  // is also tested in TestAddIncludeDictionary
  TemplateDictionary dict("test_SetTemplateGlobalValue", NULL);
  TemplateDictionary* subdict = dict.AddSectionDictionary("section1");
  TemplateDictionary* subsubdict =
    subdict->AddSectionDictionary("section1's child");
  TemplateDictionary* includedict = dict.AddIncludeDictionary("include1");

  TemplateDictionaryPeer peer(&dict);
  TemplateDictionaryPeer subdict_peer(subdict);
  TemplateDictionaryPeer subsubdict_peer(subsubdict);
  TemplateDictionaryPeer includedict_peer(includedict);

  // Setting a template value after sub dictionaries are created should
  // affect the sub dictionaries as well.
  dict.SetTemplateGlobalValue("TEMPLATEVAL", "templateval");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL", "templateval"));

  // sub dictionaries after you set the template value should also
  // get the template value
  TemplateDictionary* subdict2 = dict.AddSectionDictionary("section2");
  TemplateDictionary* includedict2 = dict.AddIncludeDictionary("include2");
  TemplateDictionaryPeer subdict2_peer(subdict2);
  TemplateDictionaryPeer includedict2_peer(includedict2);

  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL", "templateval"));

  // setting a template value on a sub dictionary should affect all the other
  // sub dictionaries and the parent as well
  subdict->SetTemplateGlobalValue("TEMPLATEVAL2", "templateval2");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));

  includedict->SetTemplateGlobalValue("TEMPLATEVAL3", "templateval3");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL3", "templateval3"));

  // you should be able to override a template value with a regular value
  // and the overwritten regular value should pass on to its children
  subdict->SetValue("TEMPLATEVAL2", "subdictval");
  includedict->SetValue("TEMPLATEVAL2", "includedictval");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL2", "subdictval"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL2", "subdictval"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL2", "includedictval"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));

  // A section shown template-globally will be shown in all its children.
  dict.ShowTemplateGlobalSection("ShownTemplateGlobalSection");
  EXPECT_FALSE(peer.IsHiddenSection("ShownTemplateGlobalSection"));

  EXPECT_FALSE(subdict2_peer.IsHiddenSection("ShownTemplateGlobalSection"));
  EXPECT_FALSE(subsubdict_peer.IsHiddenSection("ShownTemplateGlobalSection"));

  // Showing a template-global section in a child will show it in all templates
  // in the tree
  subdict->ShowTemplateGlobalSection("ShownFromAChild");
  EXPECT_FALSE(peer.IsHiddenSection("ShownFromAChild"));
  EXPECT_FALSE(subsubdict_peer.IsHiddenSection("ShownFromAChild"));

  // Asking for a section that doesn't exist shouldn't cause infinite recursion
  peer.IsHiddenSection("NAVBAR_SECTION");
}